

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsThermalEngine.cpp
# Opt level: O2

void __thiscall
chrono::ChShaftsThermalEngine::ChShaftsThermalEngine
          (ChShaftsThermalEngine *this,ChShaftsThermalEngine *other)

{
  int iVar1;
  undefined4 extraout_var;
  __shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  ChShaftsTorqueBase::ChShaftsTorqueBase
            (&this->super_ChShaftsTorqueBase,&other->super_ChShaftsTorqueBase);
  (this->super_ChShaftsTorqueBase).super_ChShaftsCouple.super_ChPhysicsItem.super_ChObj._vptr_ChObj
       = (_func_int **)&PTR__ChShaftsThermalEngine_01170998;
  (this->Tw).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->Tw).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->throttle = other->throttle;
  this->error_backward = other->error_backward;
  iVar1 = (*((other->Tw).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->_vptr_ChFunction[2])();
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChFunction,void>
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&local_20,
             (ChFunction *)CONCAT44(extraout_var,iVar1));
  std::__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->Tw).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>,
             &local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return;
}

Assistant:

ChShaftsThermalEngine::ChShaftsThermalEngine(const ChShaftsThermalEngine& other) : ChShaftsTorqueBase(other) {
    throttle = other.throttle;
    error_backward = other.error_backward;
    Tw = std::shared_ptr<ChFunction>(other.Tw->Clone());  // deep copy
}